

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t *
gs_c_fn_signature(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals,
                 gs_val_type *types,int num_types)

{
  _Bool _Var1;
  undefined3 uVar2;
  gs_val_t *pgVar3;
  gs_val_t local_48;
  int local_30;
  int local_2c;
  int i;
  int num_types_local;
  gs_val_type *types_local;
  gs_val_t *pgStack_18;
  int num_vals_local;
  gs_val_t *vals_local;
  gs_eval_t *eval_local;
  
  local_2c = num_types;
  _i = types;
  types_local._4_4_ = num_vals;
  pgStack_18 = vals;
  vals_local = (gs_val_t *)eval;
  if (num_types == num_vals) {
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      pgVar3 = pgStack_18 + local_30;
      gs_eval_cast(&local_48,(gs_eval_t *)vals_local,pgStack_18[local_30],_i[local_30]);
      pgVar3->type = local_48.type;
      pgVar3->is_return = local_48.is_return;
      *(undefined3 *)&pgVar3->field_0x5 = local_48._5_3_;
      (pgVar3->field_2).vec2_val = local_48.field_2.vec2_val;
      *(undefined8 *)((long)&pgVar3->field_2 + 8) = local_48.field_2._8_8_;
      if ((pgStack_18[local_30].is_return & 1U) != 0) {
        pgStack_18 = pgStack_18 + local_30;
        _Var1 = pgStack_18->is_return;
        uVar2 = *(undefined3 *)&pgStack_18->field_0x5;
        __return_storage_ptr__->type = pgStack_18->type;
        __return_storage_ptr__->is_return = _Var1;
        *(undefined3 *)&__return_storage_ptr__->field_0x5 = uVar2;
        (__return_storage_ptr__->field_2).vec2_val = (pgStack_18->field_2).vec2_val;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
             *(undefined8 *)((long)&pgStack_18->field_2 + 8);
        return __return_storage_ptr__;
      }
    }
    gs_val_int(__return_storage_ptr__,0);
  }
  else {
    gs_val_error(__return_storage_ptr__,"Wrong num of args to function");
  }
  return __return_storage_ptr__;
}

Assistant:

gs_val_t gs_c_fn_signature(gs_eval_t *eval, gs_val_t *vals, int num_vals, gs_val_type *types, int num_types) {
    if (num_types != num_vals) {
        return gs_val_error("Wrong num of args to function");
    }

    for (int i = 0; i < num_types; i++) {
        vals[i] = gs_eval_cast(eval, vals[i], types[i]);
        if (vals[i].is_return) return vals[i];
    }

    return gs_val_int(0);
}